

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::CollationFastLatinBuilder::getCEsFromContractionCE32
          (CollationFastLatinBuilder *this,CollationData *data,uint32_t ce32,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UErrorCode UVar2;
  bool bVar3;
  bool bVar4;
  UBool UVar5;
  char16_t cVar6;
  undefined4 uVar7;
  int64_t cce1;
  undefined8 uVar8;
  int64_t cce0;
  uint x;
  Iterator suffixes;
  uint local_dc;
  ConstChar16Ptr local_d0;
  CollationData *local_c8;
  ulong local_c0;
  UChar *local_b8;
  Iterator local_a8;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  pUVar1 = data->contexts + (ce32 >> 0xd);
  local_c0 = (ulong)(this->contractionCEs).count;
  local_c8 = data;
  UVar5 = getCEsFromCE32(this,data,-1,CONCAT22(*pUVar1,pUVar1[1]),errorCode);
  if (UVar5 == '\0') {
    cce0 = 0x101000100;
    cce1 = 0;
  }
  else {
    cce0 = this->ce0;
    cce1 = this->ce1;
  }
  addContractionEntry(this,0x1ff,cce0,cce1,errorCode);
  local_d0.p_ = pUVar1 + 2;
  UCharsTrie::Iterator::Iterator(&local_a8,&local_d0,0,errorCode);
  local_b8 = local_d0.p_;
  bVar3 = false;
  local_dc = 0xffffffff;
LAB_002387ec:
  bVar3 = !bVar3;
  while( true ) {
    do {
      UVar5 = UCharsTrie::Iterator::next(&local_a8,errorCode);
      if (UVar5 == '\0') {
        if (!bVar3) {
          addContractionEntry(this,local_dc,this->ce0,this->ce1,errorCode);
        }
        UVar2 = *errorCode;
        if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
          this->ce0 = local_c0 | 0x180000000;
          this->ce1 = 0;
        }
        UCharsTrie::Iterator::~Iterator(&local_a8);
        return UVar2 < U_ILLEGAL_ARGUMENT_ERROR;
      }
      uVar7 = local_a8.str_.fUnion.fFields.fLength;
      if (-1 < local_a8.str_.fUnion.fStackFields.fLengthAndFlags) {
        uVar7 = (int)local_a8.str_.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (uVar7 == 0) {
        cVar6 = L'\xffff';
      }
      else {
        uVar8 = local_a8.str_.fUnion.fStackFields.fBuffer;
        if (((int)local_a8.str_.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
          uVar8 = local_a8.str_.fUnion.fFields.fArray;
        }
        cVar6 = *(char16_t *)uVar8;
      }
      x = (ushort)cVar6 - 0x1e80;
      if ((cVar6 & 0xffc0U) != 0x2000) {
        x = 0xffffffff;
      }
      if ((ushort)cVar6 < 0x180) {
        x = (uint)(ushort)cVar6;
      }
    } while ((int)x < 0);
    if (x != local_dc) break;
    bVar4 = !bVar3;
    bVar3 = true;
    if (bVar4) {
      addContractionEntry(this,x,0x101000100,0,errorCode);
      bVar3 = true;
    }
  }
  if (!bVar3) {
    addContractionEntry(this,local_dc,this->ce0,this->ce1,errorCode);
  }
  uVar7 = local_a8.str_.fUnion.fFields.fLength;
  if (-1 < local_a8.str_.fUnion.fStackFields.fLengthAndFlags) {
    uVar7 = (int)local_a8.str_.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  local_dc = x;
  if (uVar7 == 1) goto code_r0x002388be;
  goto LAB_002388ea;
code_r0x002388be:
  UVar5 = getCEsFromCE32(this,local_c8,-1,local_a8.value_,errorCode);
  bVar3 = true;
  if (UVar5 == '\0') {
LAB_002388ea:
    bVar3 = false;
    addContractionEntry(this,x,0x101000100,0,errorCode);
  }
  goto LAB_002387ec;
}

Assistant:

UBool
CollationFastLatinBuilder::getCEsFromContractionCE32(const CollationData &data, uint32_t ce32,
                                                     UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    const UChar *p = data.contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no suffix match.
    // Since the original ce32 is not a prefix mapping,
    // the default ce32 must not be another contraction.
    U_ASSERT(!Collation::isContractionCE32(ce32));
    int32_t contractionIndex = contractionCEs.size();
    if(getCEsFromCE32(data, U_SENTINEL, ce32, errorCode)) {
        addContractionEntry(CollationFastLatin::CONTR_CHAR_MASK, ce0, ce1, errorCode);
    } else {
        // Bail out for c-without-contraction.
        addContractionEntry(CollationFastLatin::CONTR_CHAR_MASK, Collation::NO_CE, 0, errorCode);
    }
    // Handle an encodable contraction unless the next contraction is too long
    // and starts with the same character.
    int32_t prevX = -1;
    UBool addContraction = FALSE;
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        const UnicodeString &suffix = suffixes.getString();
        int32_t x = CollationFastLatin::getCharIndex(suffix.charAt(0));
        if(x < 0) { continue; }  // ignore anything but fast Latin text
        if(x == prevX) {
            if(addContraction) {
                // Bail out for all contractions starting with this character.
                addContractionEntry(x, Collation::NO_CE, 0, errorCode);
                addContraction = FALSE;
            }
            continue;
        }
        if(addContraction) {
            addContractionEntry(prevX, ce0, ce1, errorCode);
        }
        ce32 = (uint32_t)suffixes.getValue();
        if(suffix.length() == 1 && getCEsFromCE32(data, U_SENTINEL, ce32, errorCode)) {
            addContraction = TRUE;
        } else {
            addContractionEntry(x, Collation::NO_CE, 0, errorCode);
            addContraction = FALSE;
        }
        prevX = x;
    }
    if(addContraction) {
        addContractionEntry(prevX, ce0, ce1, errorCode);
    }
    if(U_FAILURE(errorCode)) { return FALSE; }
    // Note: There might not be any fast Latin contractions, but
    // we need to enter contraction handling anyway so that we can bail out
    // when there is a non-fast-Latin character following.
    // For example: Danish &Y<<u+umlaut, when we compare Y vs. u\u0308 we need to see the
    // following umlaut and bail out, rather than return the difference of Y vs. u.
    ce0 = ((int64_t)Collation::NO_CE_PRIMARY << 32) | CONTRACTION_FLAG | contractionIndex;
    ce1 = 0;
    return TRUE;
}